

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

Symbol * breakpoint_current(Symbol *s)

{
  Item *q;
  Symbol *s_local;
  
  if (breakpoint_local_current_ != (List *)0x0) {
    for (q = breakpoint_local_current_->next; q != breakpoint_local_current_; q = q->next) {
      if ((Symbol *)(q->element).itm == s) {
        return (Symbol *)(q->next->element).itm;
      }
    }
  }
  return s;
}

Assistant:

Symbol* breakpoint_current(Symbol* s) {
	if (breakpoint_local_current_) {
		Item* q;
		ITERATE(q, breakpoint_local_current_) {
			if (SYM(q) == s) {
				return SYM(q->next);
			}
		}
	}
	return s;
}